

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall
despot::Parser::GetNoisyNextState
          (Parser *this,vector<int,_std::allocator<int>_> *state,ACT_TYPE action,double *random)

{
  CPT *pCVar1;
  const_reference cVar2;
  int iVar3;
  pointer piVar4;
  pointer piVar5;
  int s;
  int *piVar6;
  ulong uVar7;
  long lVar8;
  
  piVar5 = (state->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar4 = (state->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  piVar6 = &(((this->prev_state_vars_).
              super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>._M_impl.
              super__Vector_impl_data._M_start)->super_NamedVar).super_Variable.curr_value;
  for (uVar7 = 0; uVar7 < (ulong)((long)piVar4 - (long)piVar5 >> 2); uVar7 = uVar7 + 1) {
    *piVar6 = piVar5[uVar7];
    piVar6 = piVar6 + 0x30;
  }
  (((this->action_vars_).super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>.
    _M_impl.super__Vector_impl_data._M_start)->super_Variable).curr_value = action;
  lVar8 = 0;
  for (uVar7 = 0; uVar7 < (ulong)((long)piVar4 - (long)piVar5 >> 2); uVar7 = uVar7 + 1) {
    cVar2 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((vector<bool,_std::allocator<bool>_> *)
                       ((long)&(((this->is_identity_).
                                 super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Bvector_base<std::allocator<bool>_>)._M_impl.
                               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                       lVar8),(long)action);
    if (cVar2) {
      piVar5 = (state->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
    }
    else {
      pCVar1 = (this->noisy_transition_funcs_).
               super__Vector_base<despot::CPT_*,_std::allocator<despot::CPT_*>_>._M_impl.
               super__Vector_impl_data._M_start[uVar7];
      iVar3 = (*(pCVar1->super_Function)._vptr_Function[0xe])(pCVar1,random);
      piVar5 = (state->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      piVar5[uVar7] = iVar3;
    }
    piVar4 = (state->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
    lVar8 = lVar8 + 0x28;
  }
  return;
}

Assistant:

void Parser::GetNoisyNextState(vector<int>& state, ACT_TYPE action,
	double& random) const {
	for (int s = 0; s < state.size(); s++) {
		prev_state_vars_[s].curr_value = state[s];
	}
	action_vars_[0].curr_value = action;

	for (int s = 0; s < state.size(); s++) {
		if (!is_identity_[s][action])
			state[s] = noisy_transition_funcs_[s]->ComputeCurrentIndex(random);
	}
}